

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_im2col_back_f32(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int64_t tmph;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined8 uVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  bool bVar38;
  float fVar39;
  long local_128;
  long local_110;
  long local_100;
  
  pgVar10 = dst->src[0];
  if (pgVar10->type == GGML_TYPE_F32) {
    pgVar11 = dst->src[1];
    if (pgVar11->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        iVar1 = dst->op_params[6];
        uVar33 = dst->ne[1];
        uVar36 = uVar33;
        if (iVar1 == 1) {
          uVar36 = dst->ne[2];
        }
        uVar19 = 1;
        uVar35 = pgVar10->ne[2];
        if (iVar1 != 1) {
          uVar35 = uVar19;
        }
        if (dst->nb[0] == 4) {
          uVar12 = pgVar11->ne[0];
          uVar29 = pgVar11->ne[1];
          iVar24 = (int)dst->nb[2];
          uVar13 = dst->ne[0];
          iVar2 = params->nth;
          iVar3 = params->ith;
          iVar4 = dst->op_params[0];
          local_100 = 0;
          uVar33 = ~((long)uVar33 >> 0x3f) & uVar33;
          iVar5 = dst->op_params[5];
          iVar6 = dst->op_params[4];
          bVar38 = iVar1 == 1;
          pvVar14 = dst->data;
          uVar15 = dst->ne[3];
          if (!bVar38) {
            uVar29 = uVar19;
            uVar15 = dst->ne[2];
            uVar33 = uVar19;
          }
          iVar7 = dst->op_params[1];
          iVar31 = (int)dst->nb[1];
          if (bVar38) {
            iVar31 = iVar24;
          }
          if (bVar38) {
            iVar24 = (int)dst->nb[3];
          }
          iVar8 = dst->op_params[3];
          iVar9 = dst->op_params[2];
          lVar30 = uVar29 * uVar12;
          lVar16 = pgVar10->ne[1];
          uVar19 = 0;
          do {
            if (uVar19 == (~((long)uVar15 >> 0x3f) & uVar15)) {
              return;
            }
            local_128 = lVar30 * iVar3;
            for (lVar25 = (long)iVar3; lVar25 < (long)uVar36; lVar25 = lVar25 + iVar2) {
              for (uVar22 = 0; uVar22 != uVar33; uVar22 = uVar22 + 1) {
                local_110 = (long)iVar9;
                for (uVar21 = 0; uVar21 != (~((long)uVar13 >> 0x3f) & uVar13); uVar21 = uVar21 + 1)
                {
                  fVar39 = 0.0;
                  lVar26 = local_128;
                  for (uVar32 = 0; uVar32 != (~((long)uVar29 >> 0x3f) & uVar29); uVar32 = uVar32 + 1
                      ) {
                    lVar20 = ((long)iVar8 + uVar22) - uVar32 * (long)iVar5;
                    lVar27 = local_110;
                    uVar34 = ~((long)uVar12 >> 0x3f) & uVar12;
                    lVar37 = lVar26;
                    while (bVar38 = uVar34 != 0, uVar34 = uVar34 - 1, bVar38) {
                      lVar17 = lVar27 / (long)iVar4;
                      if (lVar27 % (long)iVar4 == 0) {
                        if (iVar1 == 1) {
                          lVar18 = lVar20 / (long)iVar7;
                          if (lVar20 % (long)iVar7 != 0) goto LAB_0013dc1b;
                        }
                        else {
                          lVar18 = 0;
                        }
                        if ((((-1 < lVar17) && (lVar17 < lVar16)) && (-1 < lVar18)) &&
                           (lVar18 < (long)uVar35)) {
                          fVar39 = fVar39 + *(float *)((long)pgVar10->data +
                                                      lVar37 * 4 +
                                                      (lVar17 + (lVar18 + local_100) * lVar16) *
                                                      lVar30 * uVar36 * 4);
                        }
                      }
LAB_0013dc1b:
                      lVar27 = lVar27 - iVar6;
                      lVar37 = lVar37 + 1;
                    }
                    lVar26 = lVar26 + uVar12;
                  }
                  local_110 = local_110 + 1;
                  *(float *)((long)pvVar14 +
                            uVar21 * 4 +
                            uVar22 * uVar13 * 4 + lVar25 * iVar31 + uVar19 * (long)iVar24) = fVar39;
                }
              }
              local_128 = local_128 + lVar30 * iVar2;
            }
            local_100 = local_100 + uVar35;
            uVar19 = uVar19 + 1;
          } while( true );
        }
        pcVar23 = "nb0 == sizeof(float)";
        uVar28 = 0x171c;
      }
      else {
        pcVar23 = "dst->type == GGML_TYPE_F32";
        uVar28 = 0x16ff;
      }
    }
    else {
      pcVar23 = "src1->type == GGML_TYPE_F32";
      uVar28 = 0x16fe;
    }
  }
  else {
    pcVar23 = "src0->type == GGML_TYPE_F32";
    uVar28 = 0x16fd;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar28,"GGML_ASSERT(%s) failed",pcVar23);
}

Assistant:

void ggml_compute_forward_im2col_back_f32(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0]; // gradients of forward pass output
    const ggml_tensor * src1 = dst->src[1]; // convolution kernel

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS;

    const int32_t s0 = ((const int32_t *)(dst->op_params))[0];
    const int32_t s1 = ((const int32_t *)(dst->op_params))[1];
    const int32_t p0 = ((const int32_t *)(dst->op_params))[2];
    const int32_t p1 = ((const int32_t *)(dst->op_params))[3];
    const int32_t d0 = ((const int32_t *)(dst->op_params))[4];
    const int32_t d1 = ((const int32_t *)(dst->op_params))[5];
    const bool is_2D = ((const int32_t *)(dst->op_params))[6] == 1;

    const int ith = params->ith;
    const int nth = params->nth;

    const int64_t N  = is_2D ? ne3 : ne2;
    const int64_t IC = is_2D ? ne2 : ne1;
    const int64_t IH = is_2D ? ne1 : 1;
    const int64_t IW = ne0;

    const int64_t KH = is_2D ? ne11 : 1;
    const int64_t KW = ne10;

    const int64_t OH = is_2D ? ne02 : 1;
    const int64_t OW = ne01;

    int ofs0 = is_2D ? nb3 : nb2;
    int ofs1 = is_2D ? nb2 : nb1;

    GGML_ASSERT(nb0  == sizeof(float));

    // im2col: [N, IC, IH, IW] => [N, OH, OW, IC*KH*KW]
    {
        float * const wdata = (float *) dst->data;

        for (int64_t in = 0; in < N; in++) {
            for (int64_t iic = ith; iic < IC; iic += nth) {
                for (int64_t iih = 0; iih < IH; iih++) {
                    for (int64_t iiw = 0; iiw < IW; iiw++) {

                        // micro kernel
                        float grad = 0.0f;
                        for (int64_t ikh = 0; ikh < KH; ikh++) {
                            for (int64_t ikw = 0; ikw < KW; ikw++) {
                                // For s0 > 1 some values were skipped over in the forward pass.
                                // These values have tmpw % s0 != 0 and need to be skipped in the backwards pass as well.
                                const int64_t tmpw = (iiw + p0 - ikw*d0);
                                if (tmpw % s0 != 0) {
                                    continue;
                                }
                                const int64_t iow = tmpw / s0;

                                // Equivalent logic as above except for s1.
                                int64_t ioh;
                                if (is_2D) {
                                    const int64_t tmph = iih + p1 - ikh*d1;

                                    if (tmph % s1 != 0) {
                                        continue;
                                    }

                                    ioh = tmph / s1;
                                } else {
                                    ioh = 0;
                                }

                                if (iow < 0 || iow >= OW || ioh < 0 || ioh >= OH) {
                                    continue;
                                }

                                const float * const grad_in = (const float *) src0->data
                                    + (in*OH*OW + ioh*OW + iow)*(IC*KH*KW); // [IC, KH, KW]
                                grad += grad_in[iic*(KH*KW) + ikh*KW + ikw];
                            }
                        }
                        float * dst_data = (float *)((char *) wdata + (in*ofs0 + iic*ofs1)); // [IH, IW]
                        dst_data[iih*IW + iiw] = grad;
                    }
                }
            }
        }
    }
}